

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.h
# Opt level: O2

NBestEncodeResult * __thiscall
sentencepiece::ModelInterface::SampleEncodeAndScore
          (NBestEncodeResult *__return_storage_ptr__,ModelInterface *this,string_view normalized,
          float alpha,int samples,bool wor,bool include_best)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  initializer_list<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  __l;
  allocator_type local_49;
  pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
  local_48;
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  local_28;
  
  iVar1 = logging::GetMinLogLevel();
  if (iVar1 < 3) {
    local_48.first.
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_48.first.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    pcVar2 = logging::BaseName("third_party/sentencepiece/src/model_interface.h");
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6c);
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,"LOG(");
    poVar3 = std::operator<<(poVar3,"ERROR");
    poVar3 = std::operator<<(poVar3,") ");
    std::operator<<(poVar3,"Not implemented.");
    error::Die::~Die((Die *)&local_48);
  }
  local_48.first.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.first.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.first.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.second = 0.0;
  __l._M_len = 1;
  __l._M_array = &local_48;
  std::
  vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  ::vector(__return_storage_ptr__,__l,&local_49);
  std::
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)&local_48);
  std::
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

virtual NBestEncodeResult SampleEncodeAndScore(absl::string_view normalized,
                                                 float alpha, int samples,
                                                 bool wor,
                                                 bool include_best) const {
    LOG(ERROR) << "Not implemented.";
    return {{EncodeResult(), 0.0}};
  }